

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall sf2cute::SoundFont::ClearInstruments(SoundFont *this)

{
  pointer psVar1;
  shared_ptr<sf2cute::SFInstrument> *instrument;
  pointer psVar2;
  
  psVar1 = (this->instruments_).
           super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->instruments_).
                super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    ((psVar2->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    parent_file_ = (SoundFont *)0x0;
  }
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::_M_erase_at_end(&this->instruments_,
                    (this->instruments_).
                    super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void SoundFont::ClearInstruments() noexcept {
  for (const auto & instrument : instruments_) {
    instrument->reset_parent_file();
  }
  instruments_.clear();
}